

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

Tag * __thiscall
Mustache::Renderer::findTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,int pos,int endPos)

{
  char16_t cVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  int endPos_00;
  CaseSensitivity pos_00;
  QString local_48;
  
  iVar5 = QString::indexOf((QString *)content,(longlong)&this->m_tagStartMarker,pos);
  if ((iVar5 == -1 || endPos <= iVar5) ||
     (endPos_00 = QString::indexOf((QString *)content,(longlong)&this->m_tagEndMarker,
                                   iVar5 + (int)(this->m_tagStartMarker).d.size), endPos_00 == -1))
  {
    __return_storage_ptr__->type = Null;
    (__return_storage_ptr__->key).d.d = (Data *)0x0;
    (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->key).d.size = 0;
    __return_storage_ptr__->start = 0;
    __return_storage_ptr__->end = 0;
    __return_storage_ptr__->escapeMode = Escape;
    __return_storage_ptr__->indentation = 0;
    return __return_storage_ptr__;
  }
  qVar4 = (this->m_tagEndMarker).d.size;
  (__return_storage_ptr__->key).d.size = 0;
  __return_storage_ptr__->start = 0;
  __return_storage_ptr__->end = 0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
  __return_storage_ptr__->escapeMode = Escape;
  __return_storage_ptr__->indentation = 0;
  __return_storage_ptr__->type = Value;
  __return_storage_ptr__->start = iVar5;
  __return_storage_ptr__->end = (int)qVar4 + endPos_00;
  pos_00 = iVar5 + (int)(this->m_tagStartMarker).d.size;
  cVar1 = (content->d).ptr[(int)pos_00];
  iVar5 = endPos_00;
  if ((ushort)cVar1 < 0x3d) {
    if ((ushort)cVar1 < 0x26) {
      if (cVar1 == L'!') {
        __return_storage_ptr__->type = Comment;
        goto LAB_00117bc6;
      }
      if (cVar1 == L'#') {
        __return_storage_ptr__->type = SectionStart;
        readTagName(&local_48,content,pos_00 + CaseSensitive,endPos_00);
        goto LAB_00117b75;
      }
    }
    else if (cVar1 == L'&') {
      __return_storage_ptr__->escapeMode = Unescape;
      pos_00 = pos_00 + CaseSensitive;
    }
    else if (cVar1 == L'/') {
      __return_storage_ptr__->type = SectionEnd;
      readTagName(&local_48,content,pos_00 + CaseSensitive,endPos_00);
      goto LAB_00117b75;
    }
LAB_00117b5e:
    __return_storage_ptr__->type = Value;
    readTagName(&local_48,content,pos_00,iVar5);
  }
  else if ((ushort)cVar1 < 0x5e) {
    if (cVar1 == L'=') {
      __return_storage_ptr__->type = SetDelimiter;
      readSetDelimiter(this,content,pos_00 + CaseSensitive,endPos_00);
      goto LAB_00117bc6;
    }
    if (cVar1 != L'>') goto LAB_00117b5e;
    __return_storage_ptr__->type = Partial;
    readTagName(&local_48,content,pos_00 + CaseSensitive,endPos_00);
  }
  else {
    if (cVar1 != L'^') {
      if (cVar1 == L'{') {
        __return_storage_ptr__->escapeMode = Raw;
        pos_00 = pos_00 + CaseSensitive;
        iVar5 = QString::indexOf((QChar)(char16_t)content,0x7d,pos_00);
        if ((long)iVar5 == (long)__return_storage_ptr__->end - (this->m_tagEndMarker).d.size) {
          __return_storage_ptr__->end = __return_storage_ptr__->end + 1;
          iVar5 = endPos_00;
        }
      }
      goto LAB_00117b5e;
    }
    __return_storage_ptr__->type = InvertedSectionStart;
    readTagName(&local_48,content,pos_00 + CaseSensitive,endPos_00);
  }
LAB_00117b75:
  pQVar2 = &((__return_storage_ptr__->key).d.d)->super_QArrayData;
  (__return_storage_ptr__->key).d.d = local_48.d.d;
  pcVar3 = (__return_storage_ptr__->key).d.ptr;
  (__return_storage_ptr__->key).d.ptr = local_48.d.ptr;
  qVar4 = (__return_storage_ptr__->key).d.size;
  (__return_storage_ptr__->key).d.size = local_48.d.size;
  local_48.d.d = (Data *)pQVar2;
  local_48.d.ptr = pcVar3;
  local_48.d.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,8);
    }
  }
LAB_00117bc6:
  if (__return_storage_ptr__->type != Value) {
    expandTag(__return_storage_ptr__,content);
  }
  return __return_storage_ptr__;
}

Assistant:

Tag Renderer::findTag(const QString& content, int pos, int endPos)
{
	int tagStartPos = content.indexOf(m_tagStartMarker, pos);
	if (tagStartPos == -1 || tagStartPos >= endPos) {
		return Tag();
	}

	int tagEndPos = content.indexOf(m_tagEndMarker, tagStartPos + m_tagStartMarker.length());
	if (tagEndPos == -1) {
		return Tag();
	}
	tagEndPos += m_tagEndMarker.length();

	Tag tag;
	tag.type = Tag::Value;
	tag.start = tagStartPos;
	tag.end = tagEndPos;

	pos = tagStartPos + m_tagStartMarker.length();
	endPos = tagEndPos - m_tagEndMarker.length();

	QChar typeChar = content.at(pos);

	if (typeChar == '#') {
		tag.type = Tag::SectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '^') {
		tag.type = Tag::InvertedSectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '/') {
		tag.type = Tag::SectionEnd;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '!') {
		tag.type = Tag::Comment;
	} else if (typeChar == '>') {
		tag.type = Tag::Partial;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '=') {
		tag.type = Tag::SetDelimiter;
		readSetDelimiter(content, pos+1, tagEndPos - m_tagEndMarker.length());
	} else {
		if (typeChar == '&') {
			tag.escapeMode = Tag::Unescape;
			++pos;
		} else if (typeChar == '{') {
			tag.escapeMode = Tag::Raw;
			++pos;
			int endTache = content.indexOf('}', pos);
			if (endTache == tag.end - m_tagEndMarker.length()) {
				++tag.end;
			} else {
				endPos = endTache;
			}
		}
		tag.type = Tag::Value;
		tag.key = readTagName(content, pos, endPos);
	}

	if (tag.type != Tag::Value) {
		expandTag(tag, content);
	}

	return tag;
}